

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O0

ssize_t __thiscall
helics::Endpoint::send(Endpoint *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Core *pCVar1;
  string_view message;
  Modes MVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 uVar4;
  undefined4 in_register_00000034;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd8 [12];
  undefined4 in_stack_ffffffffffffffe4;
  
  MVar2 = Federate::getCurrentMode((Federate *)0x3ed01d);
  if (MVar2 != EXECUTING) {
    MVar2 = Federate::getCurrentMode((Federate *)0x3ed036);
    if (MVar2 != INITIALIZING) {
      uVar4 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffd0,(char *)this);
      message._M_str._4_4_ = in_stack_ffffffffffffffe4;
      message._0_12_ = in_stack_ffffffffffffffd8;
      InvalidFunctionCall::InvalidFunctionCall
                ((InvalidFunctionCall *)in_stack_ffffffffffffffd0,message);
      __cxa_throw(uVar4,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
    }
  }
  pCVar1 = (this->super_Interface).mCore;
  iVar3 = (*pCVar1->_vptr_Core[0x4a])
                    (pCVar1,(ulong)(uint)(this->super_Interface).handle.hid,
                     CONCAT44(in_register_00000034,__fd),__buf);
  return CONCAT44(extraout_var,iVar3);
}

Assistant:

void Endpoint::send(const void* data, size_t data_size) const
{
    if ((fed->getCurrentMode() == Federate::Modes::EXECUTING) ||
        (fed->getCurrentMode() == Federate::Modes::INITIALIZING)) {
        mCore->send(handle, data, data_size);
    } else {
        throw(InvalidFunctionCall(
            "messages not allowed outside of execution and initialization mode"));
    }
}